

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Copter.h
# Opt level: O3

void __thiscall
chrono::copter::Copter<6>::Copter
          (Copter<6> *this,ChSystem *sys,ChVector<double> *cpos,
          vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *ppos,
          bool *clockwise,bool are_prop_pos_rel,bool z_up)

{
  shared_ptr<chrono::ChBody> *psVar1;
  undefined1 auVar2 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  element_type *peVar6;
  pointer pCVar7;
  element_type *peVar8;
  double dVar9;
  undefined1 auVar10 [32];
  double dVar11;
  double dVar12;
  undefined1 auVar13 [32];
  undefined8 uVar14;
  ChQuaternion<double> CVar15;
  undefined8 uVar16;
  element_type *peVar17;
  ChBody *pCVar18;
  double *pdVar19;
  code *size;
  value_type *__x;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var20;
  undefined3 in_register_00000089;
  long lVar21;
  long lVar22;
  bool bVar23;
  undefined1 auVar24 [32];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [64];
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [16];
  undefined1 auVar34 [32];
  undefined1 auVar35 [16];
  undefined1 auVar36 [32];
  undefined1 auVar37 [16];
  shared_ptr<chrono::ChBody> prop;
  shared_ptr<chrono::ChForce> backtorque;
  shared_ptr<chrono::ChLinkMotorRotationSpeed> propmot;
  shared_ptr<chrono::ChForce> thrust;
  shared_ptr<chrono::ChFunction_Const> speed;
  value_type local_308;
  undefined1 local_2ed;
  undefined4 local_2ec;
  undefined1 local_2e8 [16];
  double dStack_2d8;
  double dStack_2d0;
  value_type local_2c8;
  value_type local_2b8;
  value_type local_2a0;
  vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *local_290;
  undefined **local_288;
  ChVector<double> *local_280;
  vector<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>
  *local_278;
  vector<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>
  *local_270;
  vector<std::shared_ptr<chrono::ChFunction_Const>,_std::allocator<std::shared_ptr<chrono::ChFunction_Const>_>_>
  *local_268;
  vector<std::shared_ptr<chrono::ChLinkMotorRotationSpeed>,_std::allocator<std::shared_ptr<chrono::ChLinkMotorRotationSpeed>_>_>
  *local_260;
  vector<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_>
  *local_258;
  bool *local_250;
  element_type *local_248;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_240;
  element_type *local_238;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_230;
  shared_ptr<chrono::ChFunction> local_228;
  value_type local_218;
  element_type *local_208;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_200;
  ChBody *local_1f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1f0;
  element_type *local_1e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1e0;
  ChBody *local_1d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1d0;
  ChLinkMotorRotationSpeed *local_1c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_1c0;
  ChBody *local_1b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_1b0;
  value_type local_1a8;
  _func_int **local_198;
  _func_int **local_190;
  undefined8 local_188;
  undefined8 uStack_180;
  double local_178;
  double dStack_170;
  double local_168;
  long local_158;
  double local_150;
  double dStack_148;
  undefined **local_140;
  undefined8 local_138;
  undefined8 local_130;
  undefined1 local_128 [32];
  double local_108;
  ChMatrix33<double> local_100;
  undefined **local_b8;
  double local_b0;
  double dStack_a8;
  double local_a0;
  ChForce *local_98;
  double dStack_90;
  double dStack_88;
  double dStack_80;
  ChMatrix33<double> local_78;
  undefined1 auVar3 [16];
  
  local_2ec = CONCAT31(in_register_00000089,are_prop_pos_rel);
  this->_vptr_Copter = (_func_int **)&PTR_GetChassisMeshFilename_abi_cxx11__0017f8a8;
  (this->chassis).super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->chassis).super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->chassis_mesh_path)._M_dataplus._M_p = (pointer)&(this->chassis_mesh_path).field_2;
  (this->chassis_mesh_path)._M_string_length = 0;
  (this->chassis_mesh_path).field_2._M_local_buf[0] = '\0';
  (this->propeller_mesh_path)._M_dataplus._M_p = (pointer)&(this->propeller_mesh_path).field_2;
  (this->propeller_mesh_path)._M_string_length = 0;
  (this->propeller_mesh_path).field_2._M_local_buf[0] = '\0';
  (this->props).
  super__Vector_base<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->props).
  super__Vector_base<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->props).
  super__Vector_base<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->rho = 1.225;
  this->rho0 = 1.225;
  this->pressure = 101325.0;
  this->pressure0 = 101325.0;
  this->Temp0 = 298.0;
  this->Temp = 298.0;
  if (z_up) {
    pdVar19 = (double *)&VECT_Z;
  }
  else {
    pdVar19 = (double *)&VECT_Y;
  }
  auVar28 = ZEXT864(0) << 0x40;
  this->backtorques =
       (vector<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>
       )auVar28._0_24_;
  this->motors = (vector<std::shared_ptr<chrono::ChLinkMotorRotationSpeed>,_std::allocator<std::shared_ptr<chrono::ChLinkMotorRotationSpeed>_>_>
                  )auVar28._24_24_;
  (this->speeds).
  super__Vector_base<std::shared_ptr<chrono::ChFunction_Const>,_std::allocator<std::shared_ptr<chrono::ChFunction_Const>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)auVar28._48_8_;
  (this->speeds).
  super__Vector_base<std::shared_ptr<chrono::ChFunction_Const>,_std::allocator<std::shared_ptr<chrono::ChFunction_Const>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)auVar28._56_8_;
  this->Altitude0 = (double)auVar28._0_8_;
  this->h0 = (double)auVar28._8_8_;
  this->up = (ChVector<double>)auVar28._16_24_;
  this->thrusts =
       (vector<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>
       )auVar28._40_24_;
  *(undefined1 (*) [64])
   &(this->motors).
    super__Vector_base<std::shared_ptr<chrono::ChLinkMotorRotationSpeed>,_std::allocator<std::shared_ptr<chrono::ChLinkMotorRotationSpeed>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = auVar28;
  size = (code *)sys;
  if ((ChVector<double> *)pdVar19 != &this->up) {
    size = std::__cxx11::string::_M_create;
    (this->up).m_data[0] = *pdVar19;
    pdVar19 = (double *)std::__cxx11::string::~string;
    if (z_up) {
      size = __cxa_atexit;
      pdVar19 = (double *)&__libc_single_threaded;
    }
    (this->up).m_data[1] = *(double *)size;
    (this->up).m_data[2] = *pdVar19;
  }
  local_270 = &this->thrusts;
  local_278 = &this->backtorques;
  local_258 = &this->props;
  local_260 = &this->motors;
  local_268 = &this->speeds;
  local_290 = ppos;
  local_250 = clockwise;
  pCVar18 = (ChBody *)ChFrame<double>::operator_new((ChFrame<double> *)0x360,(size_t)size);
  chrono::ChBody::ChBody(pCVar18,0);
  local_2e8._0_8_ = pCVar18;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::ChBody*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_2e8 + 8),pCVar18);
  uVar14 = local_2e8._0_8_;
  uVar16 = local_2e8._8_8_;
  psVar1 = &this->chassis;
  local_2e8 = ZEXT816(0);
  p_Var20 = (this->chassis).super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->chassis).super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)uVar14;
  (this->chassis).super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar16;
  if (p_Var20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var20);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2e8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2e8._8_8_);
    }
  }
  peVar6 = (psVar1->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar6 + 0x80 != (element_type *)cpos) {
    *(double *)(peVar6 + 0x80) = cpos->m_data[0];
    *(double *)(peVar6 + 0x88) = cpos->m_data[1];
    *(double *)(peVar6 + 0x90) = cpos->m_data[2];
  }
  chrono::ChVariablesBodyOwnMass::SetBodyMass(10.0);
  CVar15.m_data = _local_2e8;
  local_2e8._8_8_ = 0x3ff0000000000000;
  local_2e8._0_8_ = 0x3ff0000000000000;
  dStack_2d0 = CVar15.m_data[3];
  dStack_2d8 = 1.0;
  chrono::ChBody::SetInertiaXX
            ((psVar1->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  chrono::ChBody::SetBodyFixed
            (SUB81((psVar1->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,0
                  ));
  local_1a8.super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (psVar1->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_1a8.super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->chassis).super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  p_Var20 = (this->chassis).super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (p_Var20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var20->_M_use_count = p_Var20->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var20->_M_use_count = p_Var20->_M_use_count + 1;
    }
  }
  __x = &local_1a8;
  (**(code **)(*(long *)sys + 0x128))(sys);
  local_280 = cpos;
  if (local_1a8.super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1a8.super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  peVar6 = (this->chassis).super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  lVar22 = 0;
  lVar21 = 0;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *(ulong *)(peVar6 + 0x80);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (this->up).m_data[0];
  auVar29._8_8_ = 0;
  auVar29._0_8_ = *(double *)(peVar6 + 0x88) * (this->up).m_data[1];
  auVar4 = vfmadd231sd_fma(auVar29,auVar25,auVar4);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = *(ulong *)(peVar6 + 0x90);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (this->up).m_data[2];
  auVar4 = vfmadd132sd_fma(auVar26,auVar4,auVar5);
  local_288 = &PTR__ChFrame_0017db90;
  local_190 = (_func_int **)&PTR___Sp_counted_ptr_inplace_0017eeb8;
  local_188 = 0x3fc999999999999a;
  uStack_180 = 0x3fc999999999999a;
  this->h0 = auVar4._0_8_;
  local_198 = (_func_int **)chrono::ChClassFactory::GetGlobalClassFactory;
  do {
    pCVar18 = (ChBody *)ChFrame<double>::operator_new((ChFrame<double> *)0x360,(size_t)__x);
    chrono::ChBody::ChBody(pCVar18,0);
    local_308.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pCVar18;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::ChBody*>
              (&local_308.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ,pCVar18);
    std::vector<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_>
    ::push_back(local_258,&local_308);
    pCVar7 = (local_290->
             super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((char)local_2ec == '\0') {
      if ((ChBody *)((long)pCVar7->m_data + lVar22) !=
          local_308.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 0x80) {
        *(undefined8 *)
         (local_308.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 0x80) =
             *(undefined8 *)((long)pCVar7->m_data + lVar22);
        *(undefined8 *)
         (local_308.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 0x88) =
             *(undefined8 *)((long)pCVar7->m_data + lVar22 + 8);
        dVar9 = *(double *)((long)pCVar7->m_data + lVar22 + 0x10);
        goto LAB_00166e29;
      }
    }
    else {
      dVar11 = local_280->m_data[1];
      pdVar19 = (double *)((long)pCVar7->m_data + lVar22);
      dVar12 = pdVar19[1];
      dVar9 = local_280->m_data[2] + *(double *)((long)pCVar7->m_data + lVar22 + 0x10);
      *(double *)
       (local_308.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 0x80) =
           local_280->m_data[0] + *pdVar19;
      *(double *)
       (local_308.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 0x88) =
           dVar11 + dVar12;
LAB_00166e29:
      *(double *)
       (local_308.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 0x90) =
           dVar9;
    }
    chrono::ChVariablesBodyOwnMass::SetBodyMass(1.0);
    CVar15.m_data = _local_2e8;
    local_2e8._8_8_ = uStack_180;
    local_2e8._0_8_ = local_188;
    dStack_2d0 = CVar15.m_data[3];
    dStack_2d8 = 0.2;
    chrono::ChBody::SetInertiaXX
              (local_308.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    chrono::ChBody::SetBodyFixed
              (SUB81(local_308.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                     ,0));
    local_1b8 = local_308.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Stack_1b0 = local_308.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    if (local_308.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_308.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ->_M_use_count =
             (local_308.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_308.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ->_M_use_count =
             (local_308.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
      }
    }
    (**(code **)(*(long *)sys + 0x128))(sys,&local_1b8);
    if (p_Stack_1b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1b0);
    }
    local_2b8.super___shared_ptr<chrono::ChLinkMotorRotationSpeed,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (ChLinkMotorRotationSpeed *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<chrono::ChLinkMotorRotationSpeed,std::allocator<chrono::ChLinkMotorRotationSpeed>>
              (&local_2b8.
                super___shared_ptr<chrono::ChLinkMotorRotationSpeed,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(ChLinkMotorRotationSpeed **)&local_2b8,
               (allocator<chrono::ChLinkMotorRotationSpeed> *)local_2e8);
    peVar17 = local_2b8.
              super___shared_ptr<chrono::ChLinkMotorRotationSpeed,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    auVar2._8_8_ = _memset;
    auVar2._0_8_ = Q_ROTATE_Y_TO_Z;
    auVar3._8_8_ = _operator<<;
    auVar3._0_8_ = _ConstraintsBiLoad_Qc;
    local_2e8._8_8_ = _memset;
    local_2e8._0_8_ = Q_ROTATE_Y_TO_Z;
    dStack_2d8 = (double)_ConstraintsBiLoad_Qc;
    dStack_2d0 = _operator<<;
    if (z_up) {
      auVar2._8_8_ = _ChLinkMotorRotationSpeed;
      auVar2._0_8_ = QUNIT;
      auVar3._8_8_ = _ComputeMassProperties;
      auVar3._0_8_ = _ChBody;
      local_2e8._8_8_ = _ChLinkMotorRotationSpeed;
      local_2e8._0_8_ = QUNIT;
      dStack_2d8 = (double)_ChBody;
      dStack_2d0 = _ComputeMassProperties;
    }
    if (local_250[lVar21] == true) {
      auVar10 = vpermpd_avx2(ZEXT1632(auVar2),1);
      auVar31 = vpermpd_avx2(ZEXT1632(auVar3),0x15);
      auVar33._8_8_ = 0;
      auVar33._0_8_ = _Initialize;
      auVar34._24_8_ = _Initialize;
      auVar34._16_8_ = _SetMforce;
      auVar35._0_8_ = _Initialize ^ 0x8000000000000000;
      auVar35._8_8_ = 0x8000000000000000;
      auVar37._0_8_ = -_SetMforce;
      auVar37._8_8_ = -_Initialize;
      auVar5 = vunpcklpd_avx(auVar35,auVar33);
      auVar34._0_16_ = auVar5;
      auVar36._16_16_ = auVar3;
      auVar36._0_16_ = auVar2;
      auVar27._8_8_ = auVar3._0_8_;
      auVar27._0_8_ = auVar3._0_8_;
      auVar4 = vshufpd_avx(auVar2,auVar2,3);
      auVar24._0_8_ = auVar10._0_8_ * auVar5._0_8_;
      auVar24._8_8_ = auVar10._8_8_ * auVar5._8_8_;
      auVar24._16_8_ = auVar10._16_8_ * _SetMforce;
      auVar24._24_8_ = auVar10._24_8_ * _Initialize;
      auVar10._8_8_ = Q_FLIP_AROUND_X;
      auVar10._0_8_ = Q_FLIP_AROUND_X;
      auVar10._16_8_ = Q_FLIP_AROUND_X;
      auVar10._24_8_ = Q_FLIP_AROUND_X;
      auVar24 = vfmadd132pd_avx512vl(auVar36,auVar24,auVar10);
      auVar32._24_8_ = _Initialize;
      auVar32._16_8_ = _Initialize;
      auVar27._16_16_ = auVar4;
      auVar30._16_16_ = auVar35;
      auVar30._0_16_ = auVar37;
      auVar32._0_16_ = auVar37;
      auVar10 = vpermpd_avx2(auVar32,0x24);
      auVar4 = vfmadd213pd_fma(auVar27,auVar10,auVar24);
      auVar10 = vpermpd_avx2(auVar34,0x66);
      auVar10 = vshufpd_avx(auVar30,auVar10,9);
      auVar4 = vfmadd213pd_fma(auVar10,auVar31,ZEXT1632(auVar4));
      _local_2e8 = (double  [4])ZEXT1632(auVar4);
    }
    pCVar18 = local_308.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 0x78
    ;
    if (local_308.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (ChBody *)0x0) {
      pCVar18 = (ChBody *)0x0;
    }
    if ((char)local_2ec == '\0') {
      local_1f0 = local_308.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
      if (local_308.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_308.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_308.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_308.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_308.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi)->_M_use_count + 1;
        }
      }
      peVar6 = (this->chassis).super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      local_208 = peVar6 + 0x78;
      if (peVar6 == (element_type *)0x0) {
        local_208 = (element_type *)0x0;
      }
      local_200 = (this->chassis).super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
      if (local_200 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_200->_M_use_count = local_200->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_200->_M_use_count = local_200->_M_use_count + 1;
        }
      }
      auVar31._8_8_ = dStack_2d8;
      auVar31._0_8_ = dStack_2d8;
      auVar31._16_8_ = dStack_2d8;
      auVar31._24_8_ = dStack_2d8;
      pCVar7 = (local_290->
               super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_140 = local_288;
      local_138 = *(undefined8 *)((long)pCVar7->m_data + lVar22);
      local_130 = *(undefined8 *)((long)pCVar7->m_data + lVar22 + 8);
      auVar10 = vpermpd_avx2((undefined1  [32])_local_2e8,0xd0);
      auVar10 = vblendpd_avx(auVar10,ZEXT832(*(ulong *)((long)pCVar7->m_data + lVar22 + 0x10)),1);
      local_128 = vblendpd_avx(auVar10,auVar31,8);
      local_108 = dStack_2d0;
      local_1f8 = pCVar18;
      ChMatrix33<double>::ChMatrix33(&local_100,(ChQuaternion<double> *)local_2e8);
      (**(code **)(*(long *)peVar17 + 0x240))(peVar17,&local_1f8,&local_208,&local_140);
      p_Var20 = local_1f0;
      if (local_200 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_200);
        p_Var20 = local_1f0;
      }
    }
    else {
      local_1d0 = local_308.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
      if (local_308.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_308.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_308.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_308.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_308.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi)->_M_use_count + 1;
        }
      }
      peVar6 = (this->chassis).super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      local_1e8 = peVar6 + 0x78;
      if (peVar6 == (element_type *)0x0) {
        local_1e8 = (element_type *)0x0;
      }
      local_1e0 = (this->chassis).super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
      if (local_1e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_1e0->_M_use_count = local_1e0->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_1e0->_M_use_count = local_1e0->_M_use_count + 1;
        }
      }
      pCVar7 = (local_290->
               super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_a0 = local_280->m_data[2] + *(double *)((long)pCVar7->m_data + lVar22 + 0x10);
      local_b8 = local_288;
      pdVar19 = (double *)((long)pCVar7->m_data + lVar22);
      local_b0 = local_280->m_data[0] + *pdVar19;
      dStack_a8 = local_280->m_data[1] + pdVar19[1];
      local_98 = (ChForce *)local_2e8._0_8_;
      dStack_90 = (double)local_2e8._8_8_;
      dStack_88 = dStack_2d8;
      dStack_80 = dStack_2d0;
      local_1d8 = pCVar18;
      ChMatrix33<double>::ChMatrix33(&local_78,(ChQuaternion<double> *)local_2e8);
      (**(code **)(*(long *)peVar17 + 0x240))(peVar17,&local_1d8,&local_1e8,&local_b8);
      p_Var20 = local_1d0;
      if (local_1e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1e0);
        p_Var20 = local_1d0;
      }
    }
    if (p_Var20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var20);
    }
    local_228.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
    local_228.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         (local_228.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi + 1);
    bVar23 = __libc_single_threaded == '\0';
    (local_228.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ->_M_use_count = 1;
    (local_228.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ->_M_weak_count = 1;
    (local_228.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ->_vptr__Sp_counted_base = local_190;
    local_228.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    [1]._vptr__Sp_counted_base = local_198;
    local_228.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    [1]._M_use_count = 0;
    local_228.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    [1]._M_weak_count = 0;
    if (bVar23) {
      LOCK();
      (local_228.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_228.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_228.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count = 2;
    }
    local_218.super___shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         local_228.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_218.super___shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = local_228.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi;
    ChLinkMotorRotationSpeed::SetSpeedFunction
              (local_2b8.
               super___shared_ptr<chrono::ChLinkMotorRotationSpeed,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,&local_228);
    if (local_228.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_228.super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    local_1c8 = local_2b8.
                super___shared_ptr<chrono::ChLinkMotorRotationSpeed,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
    p_Stack_1c0 = local_2b8.
                  super___shared_ptr<chrono::ChLinkMotorRotationSpeed,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    if (local_2b8.super___shared_ptr<chrono::ChLinkMotorRotationSpeed,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_2b8.super___shared_ptr<chrono::ChLinkMotorRotationSpeed,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_2b8.
              super___shared_ptr<chrono::ChLinkMotorRotationSpeed,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_2b8.super___shared_ptr<chrono::ChLinkMotorRotationSpeed,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_2b8.
              super___shared_ptr<chrono::ChLinkMotorRotationSpeed,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    (**(code **)(*(long *)sys + 0x138))(sys,&local_1c8);
    if (p_Stack_1c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1c0);
    }
    std::
    vector<std::shared_ptr<chrono::ChLinkMotorRotationSpeed>,_std::allocator<std::shared_ptr<chrono::ChLinkMotorRotationSpeed>_>_>
    ::push_back(local_260,&local_2b8);
    std::
    vector<std::shared_ptr<chrono::ChFunction_Const>,_std::allocator<std::shared_ptr<chrono::ChFunction_Const>_>_>
    ::push_back(local_268,&local_218);
    this->u_p[lVar21] = 0.0;
    local_2a0.super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<chrono::ChForce,std::allocator<chrono::ChForce>>
              (&local_2a0.super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(ChForce **)&local_2a0,(allocator<chrono::ChForce> *)&local_2c8);
    *(element_type **)
     (local_2a0.super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 0x38) =
         local_308.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_238 = local_2a0.super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_230 = local_2a0.super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
    if (local_2a0.super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_2a0.super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        )->_M_use_count =
             (local_2a0.super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_2a0.super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        )->_M_use_count =
             (local_2a0.super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
      }
    }
    chrono::ChBody::AddForce
              (local_308.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               &local_238);
    if (local_230 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_230);
    }
    *(undefined4 *)
     (local_2a0.super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 0x40) = 0;
    chrono::ChForce::SetMforce(0.0);
    local_178 = (this->up).m_data[0];
    dStack_170 = (this->up).m_data[1];
    local_168 = (this->up).m_data[2];
    chrono::ChForce::SetRelDir
              (local_2a0.super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               &local_178);
    std::
    vector<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>::
    push_back(local_270,&local_2a0);
    local_2c8.super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<chrono::ChForce,std::allocator<chrono::ChForce>>
              (&local_2c8.super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(ChForce **)&local_2c8,(allocator<chrono::ChForce> *)&local_2ed);
    *(element_type **)
     (local_2c8.super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 0x38) =
         local_308.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_248 = local_2c8.super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_240 = local_2c8.super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
    if (local_2c8.super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_2c8.super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        )->_M_use_count =
             (local_2c8.super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_2c8.super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        )->_M_use_count =
             (local_2c8.super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
      }
    }
    chrono::ChBody::AddForce
              (local_308.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               &local_248);
    if (local_240 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_240);
    }
    *(undefined4 *)
     (local_2c8.super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 0x40) = 1;
    chrono::ChForce::SetMforce(0.0);
    local_150 = (this->up).m_data[1];
    dStack_148 = (this->up).m_data[2];
    bVar23 = local_250[lVar21];
    if (bVar23 == false) {
      local_150 = -local_150;
      dStack_148 = -dStack_148;
    }
    dVar9 = (this->up).m_data[0];
    local_158 = (ulong)(bVar23 & 1) * (long)dVar9 + (ulong)!(bool)(bVar23 & 1) * (long)-dVar9;
    chrono::ChForce::SetRelDir
              (local_2c8.super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               &local_158);
    __x = &local_2c8;
    std::
    vector<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>::
    push_back(local_278,__x);
    if (local_2c8.super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_2c8.super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_2a0.super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_2a0.super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_218.super___shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_218.super___shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_2b8.super___shared_ptr<chrono::ChLinkMotorRotationSpeed,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_2b8.
                 super___shared_ptr<chrono::ChLinkMotorRotationSpeed,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_308.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_308.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    lVar21 = lVar21 + 1;
    lVar22 = lVar22 + 0x18;
    if (lVar22 == 0x90) {
      auVar13._24_8_ = 0;
      auVar13._0_24_ = stack0xfffffffffffffd20;
      _local_2e8 = (double  [4])(auVar13 << 0x40);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<chrono::ChForce,std::allocator<chrono::ChForce>>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_2e8 + 8),(ChForce **)local_2e8
                 ,(allocator<chrono::ChForce> *)&local_308);
      uVar14 = local_2e8._0_8_;
      uVar16 = local_2e8._8_8_;
      local_2e8 = ZEXT816(0);
      p_Var20 = (this->lin_drag).super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
      (this->lin_drag).super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)uVar14;
      (this->lin_drag).super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar16;
      if (p_Var20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var20);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2e8._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2e8._8_8_);
        }
      }
      peVar8 = (this->lin_drag).super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      *(element_type **)(peVar8 + 0x38) =
           (this->chassis).super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      *(undefined4 *)(peVar8 + 0x40) = 0;
      chrono::ChForce::SetMforce(0.0);
      return;
    }
  } while( true );
}

Assistant:

Copter<nop>::Copter(ChSystem& sys,
                    const ChVector<>& cpos,
                    std::vector<ChVector<>> ppos,
                    const bool clockwise[],
                    bool are_prop_pos_rel,
                    bool z_up) {
    // TODO: ChBodyAuxRef here might be more convenient
    up = (z_up) ? VECT_Z : VECT_Y;
    chassis = chrono_types::make_shared<ChBody>();
    chassis->SetPos(cpos);
    // placeholder Data.
    chassis->SetMass(10);
    chassis->SetInertiaXX(ChVector<>(1, 1, 1));
    chassis->SetBodyFixed(false);
    sys.AddBody(chassis);
    h0 = chassis->GetPos() ^ up;
    // 26.4 inch propellers
    for (int p = 0; p < nop; p++) {
        auto prop = chrono_types::make_shared<ChBody>();
        props.push_back(prop);
        if (are_prop_pos_rel) {
            prop->SetPos(cpos + ppos[p]);
        } else {
            prop->SetPos(ppos[p]);
        }
        // Data from little hexy, page 132.
        prop->SetMass(1);
        prop->SetInertiaXX(ChVector<>(0.2, 0.2, 0.2));
        prop->SetBodyFixed(false);
        sys.AddBody(prop);

        auto propmot = chrono_types::make_shared<ChLinkMotorRotationSpeed>();
        ChQuaternion<> motor_rot = Q_ROTATE_Y_TO_Z;
        if (z_up) {
            motor_rot = QUNIT;
        };
        if (clockwise[p]) {
            motor_rot = Q_FLIP_AROUND_X * motor_rot;
        };
        
        if (are_prop_pos_rel) {
            propmot->Initialize(prop, chassis, ChFrame<>(cpos + ppos[p], motor_rot)); 
        } else {
            propmot->Initialize(prop, chassis, ChFrame<>(ppos[p], motor_rot));
        }
        auto speed = chrono_types::make_shared<ChFunction_Const>(0);
        propmot->SetSpeedFunction(speed);
        sys.AddLink(propmot);

        motors.push_back(propmot);
        speeds.push_back(speed);

        u_p[p] = 0;
        auto thrust = chrono_types::make_shared<ChForce>();
        thrust->SetBody(prop.get());
        prop->AddForce(thrust);
        thrust->SetMode(ChForce::FORCE);
        thrust->SetMforce(0);
        thrust->SetRelDir(up);
        thrusts.push_back(thrust);

        auto backtorque = std::make_shared<ChForce>();
        backtorque->SetBody(prop.get());
        prop->AddForce(backtorque);
        backtorque->SetMode(ChForce::TORQUE);
        backtorque->SetMforce(0);
        // Resistance Torque direction opposed to omega
        ChVector<> tdir = (clockwise[p]) ? up : -up;
        backtorque->SetRelDir(tdir);
        backtorques.push_back(backtorque);
    }

    // linear drag on copter body
    lin_drag = std::make_shared<ChForce>();
    lin_drag->SetBody(chassis.get());
    lin_drag->SetMode(ChForce::FORCE);
    lin_drag->SetMforce(0);
}